

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<8,_16781328,_true,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  byte bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [28];
  char cVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong *puVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar43 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar71 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  float fVar76;
  vfloat4 a0;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  float fVar82;
  undefined1 auVar81 [32];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar94;
  undefined1 auVar93 [32];
  float fVar95;
  undefined1 auVar96 [32];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [64];
  undefined1 auVar104 [32];
  float fVar105;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  float fStack_14e0;
  float local_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar3 = ray->tfar;
    auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar3) {
      aVar8 = (ray->dir).field_0.field_1;
      auVar50 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
      auVar51 = vrsqrtss_avx(auVar50,auVar50);
      fVar76 = auVar51._0_4_;
      fVar4 = (ray->dir).field_0.m128[0];
      fVar5 = (ray->dir).field_0.m128[1];
      local_1218[0] = fVar76 * 1.5 - auVar50._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
      fVar76 = (ray->dir).field_0.m128[2];
      auVar58 = vshufps_avx(ZEXT416((uint)local_1218[0]),ZEXT416((uint)local_1218[0]),0);
      auVar77._0_4_ = aVar8.x * auVar58._0_4_;
      auVar77._4_4_ = aVar8.y * auVar58._4_4_;
      auVar77._8_4_ = aVar8.z * auVar58._8_4_;
      auVar77._12_4_ = aVar8.field_3.w * auVar58._12_4_;
      auVar51 = vshufpd_avx(auVar77,auVar77,1);
      auVar50 = vmovshdup_avx(auVar77);
      auVar88._8_4_ = 0x80000000;
      auVar88._0_8_ = 0x8000000080000000;
      auVar88._12_4_ = 0x80000000;
      auVar80._12_4_ = 0;
      auVar80._0_12_ = ZEXT812(0);
      auVar80 = auVar80 << 0x20;
      auVar86 = vunpckhps_avx(auVar77,auVar80);
      auVar68 = vshufps_avx(auVar86,ZEXT416(auVar50._0_4_ ^ 0x80000000),0x41);
      auVar86._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
      auVar86._8_8_ = auVar51._8_8_ ^ auVar88._8_8_;
      auVar86 = vinsertps_avx(auVar86,auVar77,0x2a);
      auVar50 = vdpps_avx(auVar68,auVar68,0x7f);
      auVar51 = vdpps_avx(auVar86,auVar86,0x7f);
      auVar50 = vcmpps_avx(auVar51,auVar50,1);
      auVar50 = vshufps_avx(auVar50,auVar50,0);
      auVar50 = vblendvps_avx(auVar86,auVar68,auVar50);
      auVar51 = vdpps_avx(auVar50,auVar50,0x7f);
      auVar86 = vrsqrtss_avx(auVar51,auVar51);
      fVar83 = auVar86._0_4_;
      auVar51 = ZEXT416((uint)(fVar83 * 1.5 - auVar51._0_4_ * 0.5 * fVar83 * fVar83 * fVar83));
      auVar51 = vshufps_avx(auVar51,auVar51,0);
      auVar43._0_4_ = auVar50._0_4_ * auVar51._0_4_;
      auVar43._4_4_ = auVar50._4_4_ * auVar51._4_4_;
      auVar43._8_4_ = auVar50._8_4_ * auVar51._8_4_;
      auVar43._12_4_ = auVar50._12_4_ * auVar51._12_4_;
      auVar50 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar51 = vshufps_avx(auVar77,auVar77,0xc9);
      auVar89._0_4_ = auVar51._0_4_ * auVar43._0_4_;
      auVar89._4_4_ = auVar51._4_4_ * auVar43._4_4_;
      auVar89._8_4_ = auVar51._8_4_ * auVar43._8_4_;
      auVar89._12_4_ = auVar51._12_4_ * auVar43._12_4_;
      auVar87._0_4_ = auVar50._0_4_ * auVar77._0_4_;
      auVar87._4_4_ = auVar50._4_4_ * auVar77._4_4_;
      auVar87._8_4_ = auVar50._8_4_ * auVar77._8_4_;
      auVar87._12_4_ = auVar50._12_4_ * auVar77._12_4_;
      auVar50 = vsubps_avx(auVar87,auVar89);
      auVar86 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar50 = vdpps_avx(auVar86,auVar86,0x7f);
      auVar51 = vrsqrtss_avx(auVar50,auVar50);
      fVar83 = auVar51._0_4_;
      auVar50 = ZEXT416((uint)(fVar83 * 1.5 - fVar83 * fVar83 * fVar83 * auVar50._0_4_ * 0.5));
      auVar50 = vshufps_avx(auVar50,auVar50,0);
      auVar51._0_4_ = auVar86._0_4_ * auVar50._0_4_;
      auVar51._4_4_ = auVar86._4_4_ * auVar50._4_4_;
      auVar51._8_4_ = auVar86._8_4_ * auVar50._8_4_;
      auVar51._12_4_ = auVar86._12_4_ * auVar50._12_4_;
      auVar50._0_4_ = auVar58._0_4_ * auVar77._0_4_;
      auVar50._4_4_ = auVar58._4_4_ * auVar77._4_4_;
      auVar50._8_4_ = auVar58._8_4_ * auVar77._8_4_;
      auVar50._12_4_ = auVar58._12_4_ * auVar77._12_4_;
      auVar86 = vunpcklps_avx(auVar43,auVar50);
      auVar50 = vunpckhps_avx(auVar43,auVar50);
      auVar58 = vunpcklps_avx(auVar51,auVar80);
      auVar51 = vunpckhps_avx(auVar51,auVar80);
      local_11e8 = vunpcklps_avx(auVar50,auVar51);
      local_1208 = vunpcklps_avx(auVar86,auVar58);
      local_11f8 = vunpckhps_avx(auVar86,auVar58);
      puVar38 = local_11d0;
      auVar86 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar58._8_4_ = 0x7fffffff;
      auVar58._0_8_ = 0x7fffffff7fffffff;
      auVar58._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx((undefined1  [16])aVar8,auVar58);
      auVar68._8_4_ = 0x219392ef;
      auVar68._0_8_ = 0x219392ef219392ef;
      auVar68._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar50,auVar68,1);
      auVar69._8_4_ = 0x3f800000;
      auVar69._0_8_ = 0x3f8000003f800000;
      auVar69._12_4_ = 0x3f800000;
      auVar51 = vdivps_avx(auVar69,(undefined1  [16])aVar8);
      auVar70._8_4_ = 0x5d5e0b6b;
      auVar70._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar70._12_4_ = 0x5d5e0b6b;
      auVar50 = vblendvps_avx(auVar51,auVar70,auVar50);
      auVar59._0_4_ = auVar50._0_4_ * 0.99999964;
      auVar59._4_4_ = auVar50._4_4_ * 0.99999964;
      auVar59._8_4_ = auVar50._8_4_ * 0.99999964;
      auVar59._12_4_ = auVar50._12_4_ * 0.99999964;
      fVar83 = (ray->org).field_0.m128[0];
      fVar6 = (ray->org).field_0.m128[1];
      auVar42._0_4_ = auVar50._0_4_ * 1.0000004;
      auVar42._4_4_ = auVar50._4_4_ * 1.0000004;
      auVar42._8_4_ = auVar50._8_4_ * 1.0000004;
      auVar42._12_4_ = auVar50._12_4_ * 1.0000004;
      fVar7 = (ray->org).field_0.m128[2];
      auVar58 = vshufps_avx(auVar59,auVar59,0);
      auVar50 = vmovshdup_avx(auVar59);
      auVar68 = vshufps_avx(auVar59,auVar59,0x55);
      auVar51 = vshufpd_avx(auVar59,auVar59,1);
      auVar80 = vshufps_avx(auVar59,auVar59,0xaa);
      auVar69 = vshufps_avx(auVar42,auVar42,0);
      auVar70 = vshufps_avx(auVar42,auVar42,0x55);
      auVar67 = ZEXT1664(auVar70);
      auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
      uVar40 = (ulong)(auVar59._0_4_ < 0.0) * 0x20;
      uVar37 = (ulong)(auVar50._0_4_ < 0.0) << 5 | 0x40;
      uVar39 = (ulong)(auVar51._0_4_ < 0.0) << 5 | 0x80;
      auVar50 = vshufps_avx(auVar86,auVar86,0);
      auVar106._16_16_ = auVar50;
      auVar106._0_16_ = auVar50;
      auVar51 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar115._16_16_ = auVar51;
      auVar115._0_16_ = auVar51;
LAB_00e51e32:
      if (puVar38 != &local_11d8) {
        uVar34 = puVar38[-1];
        puVar38 = puVar38 + -1;
        do {
          fVar3 = (ray->dir).field_0.m128[3];
          auVar41._4_4_ = fVar3;
          auVar41._0_4_ = fVar3;
          auVar41._8_4_ = fVar3;
          auVar41._12_4_ = fVar3;
          auVar41._16_4_ = fVar3;
          auVar41._20_4_ = fVar3;
          auVar41._24_4_ = fVar3;
          auVar41._28_4_ = fVar3;
          fVar95 = 1.0 - fVar3;
          auVar86 = vshufps_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),0);
          auVar57 = ZEXT3264(CONCAT1616(auVar86,auVar86));
          auVar59 = vshufps_avx(ZEXT416((uint)(fVar95 * 0.0)),ZEXT416((uint)(fVar95 * 0.0)),0);
          auVar49 = ZEXT3264(CONCAT1616(auVar59,auVar59));
          do {
            if ((uVar34 & 8) != 0) {
              auVar67 = ZEXT1664(auVar67._0_16_);
              cVar32 = (**(code **)((long)This->leafIntersector +
                                   (ulong)*(byte *)(uVar34 & 0xfffffffffffffff0) * 0x40 + 8))
                                 (local_1218,ray,context);
              auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
              if (cVar32 != '\0') {
                ray->tfar = -INFINITY;
                return;
              }
              goto LAB_00e51e32;
            }
            uVar35 = (uint)uVar34 & 7;
            uVar33 = uVar34 & 0xfffffffffffffff0;
            if (uVar35 == 3) {
              auVar31 = *(undefined1 (*) [28])(uVar33 + 0x140);
              fVar95 = auVar51._12_4_;
              auVar47._0_4_ =
                   fVar4 * *(float *)(uVar33 + 0x40) +
                   *(float *)(uVar33 + 0xa0) * fVar5 + *(float *)(uVar33 + 0x100) * fVar76;
              auVar47._4_4_ =
                   fVar4 * *(float *)(uVar33 + 0x44) +
                   *(float *)(uVar33 + 0xa4) * fVar5 + *(float *)(uVar33 + 0x104) * fVar76;
              auVar47._8_4_ =
                   fVar4 * *(float *)(uVar33 + 0x48) +
                   *(float *)(uVar33 + 0xa8) * fVar5 + *(float *)(uVar33 + 0x108) * fVar76;
              auVar47._12_4_ =
                   fVar4 * *(float *)(uVar33 + 0x4c) +
                   *(float *)(uVar33 + 0xac) * fVar5 + *(float *)(uVar33 + 0x10c) * fVar76;
              auVar47._16_4_ =
                   fVar4 * *(float *)(uVar33 + 0x50) +
                   *(float *)(uVar33 + 0xb0) * fVar5 + *(float *)(uVar33 + 0x110) * fVar76;
              auVar47._20_4_ =
                   fVar4 * *(float *)(uVar33 + 0x54) +
                   *(float *)(uVar33 + 0xb4) * fVar5 + *(float *)(uVar33 + 0x114) * fVar76;
              auVar47._24_4_ =
                   fVar4 * *(float *)(uVar33 + 0x58) +
                   *(float *)(uVar33 + 0xb8) * fVar5 + *(float *)(uVar33 + 0x118) * fVar76;
              auVar47._28_4_ = fVar95 + fVar76 + auVar49._28_4_;
              auVar54._0_4_ =
                   fVar4 * *(float *)(uVar33 + 0x60) +
                   *(float *)(uVar33 + 0x120) * fVar76 + fVar5 * *(float *)(uVar33 + 0xc0);
              auVar54._4_4_ =
                   fVar4 * *(float *)(uVar33 + 100) +
                   *(float *)(uVar33 + 0x124) * fVar76 + fVar5 * *(float *)(uVar33 + 0xc4);
              auVar54._8_4_ =
                   fVar4 * *(float *)(uVar33 + 0x68) +
                   *(float *)(uVar33 + 0x128) * fVar76 + fVar5 * *(float *)(uVar33 + 200);
              auVar54._12_4_ =
                   fVar4 * *(float *)(uVar33 + 0x6c) +
                   *(float *)(uVar33 + 300) * fVar76 + fVar5 * *(float *)(uVar33 + 0xcc);
              auVar54._16_4_ =
                   fVar4 * *(float *)(uVar33 + 0x70) +
                   *(float *)(uVar33 + 0x130) * fVar76 + fVar5 * *(float *)(uVar33 + 0xd0);
              auVar54._20_4_ =
                   fVar4 * *(float *)(uVar33 + 0x74) +
                   *(float *)(uVar33 + 0x134) * fVar76 + fVar5 * *(float *)(uVar33 + 0xd4);
              auVar54._24_4_ =
                   fVar4 * *(float *)(uVar33 + 0x78) +
                   *(float *)(uVar33 + 0x138) * fVar76 + fVar5 * *(float *)(uVar33 + 0xd8);
              auVar54._28_4_ = fVar95 + auVar50._12_4_ + fVar76;
              auVar107._0_4_ =
                   *(float *)(uVar33 + 0x80) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xe0) +
                   fVar76 * *(float *)*(undefined1 (*) [28])(uVar33 + 0x140);
              auVar107._4_4_ =
                   *(float *)(uVar33 + 0x84) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xe4) + fVar76 * *(float *)(uVar33 + 0x144);
              auVar107._8_4_ =
                   *(float *)(uVar33 + 0x88) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xe8) + fVar76 * *(float *)(uVar33 + 0x148);
              auVar107._12_4_ =
                   *(float *)(uVar33 + 0x8c) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xec) + fVar76 * *(float *)(uVar33 + 0x14c);
              auVar107._16_4_ =
                   *(float *)(uVar33 + 0x90) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xf0) + fVar76 * *(float *)(uVar33 + 0x150);
              auVar107._20_4_ =
                   *(float *)(uVar33 + 0x94) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xf4) + fVar76 * *(float *)(uVar33 + 0x154);
              auVar107._24_4_ =
                   *(float *)(uVar33 + 0x98) * fVar4 +
                   fVar5 * *(float *)(uVar33 + 0xf8) + fVar76 * *(float *)(uVar33 + 0x158);
              auVar107._28_4_ = fVar95 + auVar50._12_4_ + fVar95;
              auVar64._8_4_ = 0x7fffffff;
              auVar64._0_8_ = 0x7fffffff7fffffff;
              auVar64._12_4_ = 0x7fffffff;
              auVar64._16_4_ = 0x7fffffff;
              auVar64._20_4_ = 0x7fffffff;
              auVar64._24_4_ = 0x7fffffff;
              auVar64._28_4_ = 0x7fffffff;
              auVar46 = vandps_avx(auVar47,auVar64);
              auVar73._8_4_ = 0x219392ef;
              auVar73._0_8_ = 0x219392ef219392ef;
              auVar73._12_4_ = 0x219392ef;
              auVar73._16_4_ = 0x219392ef;
              auVar73._20_4_ = 0x219392ef;
              auVar73._24_4_ = 0x219392ef;
              auVar73._28_4_ = 0x219392ef;
              auVar46 = vcmpps_avx(auVar46,auVar73,1);
              auVar10 = vblendvps_avx(auVar47,auVar73,auVar46);
              auVar46 = vandps_avx(auVar54,auVar64);
              auVar46 = vcmpps_avx(auVar46,auVar73,1);
              auVar12 = vblendvps_avx(auVar54,auVar73,auVar46);
              auVar46 = vandps_avx(auVar107,auVar64);
              auVar46 = vcmpps_avx(auVar46,auVar73,1);
              auVar46 = vblendvps_avx(auVar107,auVar73,auVar46);
              auVar11 = vrcpps_avx(auVar10);
              fVar105 = auVar11._0_4_;
              fVar108 = auVar11._4_4_;
              auVar20._4_4_ = fVar108 * auVar10._4_4_;
              auVar20._0_4_ = fVar105 * auVar10._0_4_;
              fVar109 = auVar11._8_4_;
              auVar20._8_4_ = fVar109 * auVar10._8_4_;
              fVar110 = auVar11._12_4_;
              auVar20._12_4_ = fVar110 * auVar10._12_4_;
              fVar111 = auVar11._16_4_;
              auVar20._16_4_ = fVar111 * auVar10._16_4_;
              fVar112 = auVar11._20_4_;
              auVar20._20_4_ = fVar112 * auVar10._20_4_;
              fVar113 = auVar11._24_4_;
              auVar20._24_4_ = fVar113 * auVar10._24_4_;
              auVar20._28_4_ = auVar10._28_4_;
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = 0x3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar74._16_4_ = 0x3f800000;
              auVar74._20_4_ = 0x3f800000;
              auVar74._24_4_ = 0x3f800000;
              auVar74._28_4_ = 0x3f800000;
              auVar11 = vsubps_avx(auVar74,auVar20);
              auVar10 = vrcpps_avx(auVar12);
              fVar105 = fVar105 + fVar105 * auVar11._0_4_;
              fVar108 = fVar108 + fVar108 * auVar11._4_4_;
              fVar109 = fVar109 + fVar109 * auVar11._8_4_;
              fVar110 = fVar110 + fVar110 * auVar11._12_4_;
              fVar111 = fVar111 + fVar111 * auVar11._16_4_;
              fVar112 = fVar112 + fVar112 * auVar11._20_4_;
              fVar113 = fVar113 + fVar113 * auVar11._24_4_;
              fVar114 = auVar10._0_4_;
              fVar116 = auVar10._4_4_;
              auVar21._4_4_ = fVar116 * auVar12._4_4_;
              auVar21._0_4_ = fVar114 * auVar12._0_4_;
              fVar117 = auVar10._8_4_;
              auVar21._8_4_ = fVar117 * auVar12._8_4_;
              fVar118 = auVar10._12_4_;
              auVar21._12_4_ = fVar118 * auVar12._12_4_;
              fVar119 = auVar10._16_4_;
              auVar21._16_4_ = fVar119 * auVar12._16_4_;
              fVar120 = auVar10._20_4_;
              auVar21._20_4_ = fVar120 * auVar12._20_4_;
              fVar121 = auVar10._24_4_;
              auVar21._24_4_ = fVar121 * auVar12._24_4_;
              auVar21._28_4_ = auVar11._28_4_;
              auVar10 = vsubps_avx(auVar74,auVar21);
              fVar114 = fVar114 + fVar114 * auVar10._0_4_;
              fVar116 = fVar116 + fVar116 * auVar10._4_4_;
              fVar117 = fVar117 + fVar117 * auVar10._8_4_;
              fVar118 = fVar118 + fVar118 * auVar10._12_4_;
              fVar119 = fVar119 + fVar119 * auVar10._16_4_;
              fVar120 = fVar120 + fVar120 * auVar10._20_4_;
              fVar121 = fVar121 + fVar121 * auVar10._24_4_;
              auVar10 = vrcpps_avx(auVar46);
              local_1238 = auVar59._0_4_;
              fStack_1234 = auVar59._4_4_;
              fStack_1230 = auVar59._8_4_;
              fStack_122c = auVar59._12_4_;
              fVar82 = auVar97._28_4_ + fStack_122c;
              auVar104._0_4_ = fVar3 * *(float *)(uVar33 + 0x1e0) + local_1238;
              auVar104._4_4_ = fVar3 * *(float *)(uVar33 + 0x1e4) + fStack_1234;
              auVar104._8_4_ = fVar3 * *(float *)(uVar33 + 0x1e8) + fStack_1230;
              auVar104._12_4_ = fVar3 * *(float *)(uVar33 + 0x1ec) + fStack_122c;
              auVar104._16_4_ = fVar3 * *(float *)(uVar33 + 0x1f0) + local_1238;
              auVar104._20_4_ = fVar3 * *(float *)(uVar33 + 500) + fStack_1234;
              auVar104._24_4_ = fVar3 * *(float *)(uVar33 + 0x1f8) + fStack_1230;
              auVar104._28_4_ = auVar42._12_4_ + fStack_122c;
              fVar95 = auVar10._0_4_;
              fVar98 = auVar10._4_4_;
              auVar12._4_4_ = auVar46._4_4_ * fVar98;
              auVar12._0_4_ = auVar46._0_4_ * fVar95;
              fVar99 = auVar10._8_4_;
              auVar12._8_4_ = auVar46._8_4_ * fVar99;
              fVar100 = auVar10._12_4_;
              auVar12._12_4_ = auVar46._12_4_ * fVar100;
              fVar101 = auVar10._16_4_;
              auVar12._16_4_ = auVar46._16_4_ * fVar101;
              fVar102 = auVar10._20_4_;
              auVar12._20_4_ = auVar46._20_4_ * fVar102;
              fVar103 = auVar10._24_4_;
              auVar12._24_4_ = auVar46._24_4_ * fVar103;
              auVar12._28_4_ = auVar46._28_4_;
              auVar46 = vsubps_avx(auVar74,auVar12);
              fVar95 = fVar95 + fVar95 * auVar46._0_4_;
              fVar98 = fVar98 + fVar98 * auVar46._4_4_;
              fVar99 = fVar99 + fVar99 * auVar46._8_4_;
              fVar100 = fVar100 + fVar100 * auVar46._12_4_;
              fVar101 = fVar101 + fVar101 * auVar46._16_4_;
              fVar102 = fVar102 + fVar102 * auVar46._20_4_;
              fVar103 = fVar103 + fVar103 * auVar46._24_4_;
              auVar65._0_4_ = local_1238 + fVar3 * *(float *)(uVar33 + 0x200);
              auVar65._4_4_ = fStack_1234 + fVar3 * *(float *)(uVar33 + 0x204);
              auVar65._8_4_ = fStack_1230 + fVar3 * *(float *)(uVar33 + 0x208);
              auVar65._12_4_ = fStack_122c + fVar3 * *(float *)(uVar33 + 0x20c);
              auVar65._16_4_ = local_1238 + fVar3 * *(float *)(uVar33 + 0x210);
              auVar65._20_4_ = fStack_1234 + fVar3 * *(float *)(uVar33 + 0x214);
              auVar65._24_4_ = fStack_1230 + fVar3 * *(float *)(uVar33 + 0x218);
              auVar65._28_4_ = fStack_122c + *(float *)(uVar33 + 0xfc);
              fVar75 = *(float *)(uVar33 + 0xbc) + *(float *)(uVar33 + 0x17c) + 1.0;
              fVar94 = *(float *)(uVar33 + 0x13c) + *(float *)(uVar33 + 0x19c);
              local_14d8 = auVar86._0_4_;
              fStack_14d4 = auVar86._4_4_;
              fStack_14d0 = auVar86._8_4_;
              fStack_14cc = auVar86._12_4_;
              auVar55._0_4_ = local_14d8 + fVar3 * *(float *)(uVar33 + 0x220);
              auVar55._4_4_ = fStack_14d4 + fVar3 * *(float *)(uVar33 + 0x224);
              auVar55._8_4_ = fStack_14d0 + fVar3 * *(float *)(uVar33 + 0x228);
              auVar55._12_4_ = fStack_14cc + fVar3 * *(float *)(uVar33 + 0x22c);
              auVar55._16_4_ = local_14d8 + fVar3 * *(float *)(uVar33 + 0x230);
              auVar55._20_4_ = fStack_14d4 + fVar3 * *(float *)(uVar33 + 0x234);
              auVar55._24_4_ = fStack_14d0 + fVar3 * *(float *)(uVar33 + 0x238);
              auVar55._28_4_ = fStack_14cc + auVar10._28_4_;
              auVar90._0_4_ = fVar3 * *(float *)(uVar33 + 0x240) + local_14d8;
              auVar90._4_4_ = fVar3 * *(float *)(uVar33 + 0x244) + fStack_14d4;
              auVar90._8_4_ = fVar3 * *(float *)(uVar33 + 0x248) + fStack_14d0;
              auVar90._12_4_ = fVar3 * *(float *)(uVar33 + 0x24c) + fStack_14cc;
              auVar90._16_4_ = fVar3 * *(float *)(uVar33 + 0x250) + local_14d8;
              auVar90._20_4_ = fVar3 * *(float *)(uVar33 + 0x254) + fStack_14d4;
              auVar90._24_4_ = fVar3 * *(float *)(uVar33 + 600) + fStack_14d0;
              auVar90._28_4_ = *(float *)(uVar33 + 0xbc) + fStack_14cc;
              local_14f8 = auVar31._0_4_;
              fStack_14f4 = auVar31._4_4_;
              fStack_14f0 = auVar31._8_4_;
              fStack_14ec = auVar31._12_4_;
              fStack_14e8 = auVar31._16_4_;
              fStack_14e4 = auVar31._20_4_;
              fStack_14e0 = auVar31._24_4_;
              auVar93._0_4_ = fVar3 * *(float *)(uVar33 + 0x260) + local_14d8;
              auVar93._4_4_ = fVar3 * *(float *)(uVar33 + 0x264) + fStack_14d4;
              auVar93._8_4_ = fVar3 * *(float *)(uVar33 + 0x268) + fStack_14d0;
              auVar93._12_4_ = fVar3 * *(float *)(uVar33 + 0x26c) + fStack_14cc;
              auVar93._16_4_ = fVar3 * *(float *)(uVar33 + 0x270) + local_14d8;
              auVar93._20_4_ = fVar3 * *(float *)(uVar33 + 0x274) + fStack_14d4;
              auVar93._24_4_ = fVar3 * *(float *)(uVar33 + 0x278) + fStack_14d0;
              auVar93._28_4_ = fVar94 + fStack_14cc;
              auVar79._0_4_ =
                   fVar83 * *(float *)(uVar33 + 0x40) +
                   fVar6 * *(float *)(uVar33 + 0xa0) +
                   *(float *)(uVar33 + 0x100) * fVar7 + *(float *)(uVar33 + 0x160);
              auVar79._4_4_ =
                   fVar83 * *(float *)(uVar33 + 0x44) +
                   fVar6 * *(float *)(uVar33 + 0xa4) +
                   *(float *)(uVar33 + 0x104) * fVar7 + *(float *)(uVar33 + 0x164);
              auVar79._8_4_ =
                   fVar83 * *(float *)(uVar33 + 0x48) +
                   fVar6 * *(float *)(uVar33 + 0xa8) +
                   *(float *)(uVar33 + 0x108) * fVar7 + *(float *)(uVar33 + 0x168);
              auVar79._12_4_ =
                   fVar83 * *(float *)(uVar33 + 0x4c) +
                   fVar6 * *(float *)(uVar33 + 0xac) +
                   *(float *)(uVar33 + 0x10c) * fVar7 + *(float *)(uVar33 + 0x16c);
              auVar79._16_4_ =
                   fVar83 * *(float *)(uVar33 + 0x50) +
                   fVar6 * *(float *)(uVar33 + 0xb0) +
                   *(float *)(uVar33 + 0x110) * fVar7 + *(float *)(uVar33 + 0x170);
              auVar79._20_4_ =
                   fVar83 * *(float *)(uVar33 + 0x54) +
                   fVar6 * *(float *)(uVar33 + 0xb4) +
                   *(float *)(uVar33 + 0x114) * fVar7 + *(float *)(uVar33 + 0x174);
              auVar79._24_4_ =
                   fVar83 * *(float *)(uVar33 + 0x58) +
                   fVar6 * *(float *)(uVar33 + 0xb8) +
                   *(float *)(uVar33 + 0x118) * fVar7 + *(float *)(uVar33 + 0x178);
              auVar79._28_4_ = fStack_14cc + fVar75;
              auVar85._0_4_ =
                   fVar83 * *(float *)(uVar33 + 0x60) +
                   *(float *)(uVar33 + 0x120) * fVar7 + *(float *)(uVar33 + 0x180) +
                   fVar6 * *(float *)(uVar33 + 0xc0);
              auVar85._4_4_ =
                   fVar83 * *(float *)(uVar33 + 100) +
                   *(float *)(uVar33 + 0x124) * fVar7 + *(float *)(uVar33 + 0x184) +
                   fVar6 * *(float *)(uVar33 + 0xc4);
              auVar85._8_4_ =
                   fVar83 * *(float *)(uVar33 + 0x68) +
                   *(float *)(uVar33 + 0x128) * fVar7 + *(float *)(uVar33 + 0x188) +
                   fVar6 * *(float *)(uVar33 + 200);
              auVar85._12_4_ =
                   fVar83 * *(float *)(uVar33 + 0x6c) +
                   *(float *)(uVar33 + 300) * fVar7 + *(float *)(uVar33 + 0x18c) +
                   fVar6 * *(float *)(uVar33 + 0xcc);
              auVar85._16_4_ =
                   fVar83 * *(float *)(uVar33 + 0x70) +
                   *(float *)(uVar33 + 0x130) * fVar7 + *(float *)(uVar33 + 400) +
                   fVar6 * *(float *)(uVar33 + 0xd0);
              auVar85._20_4_ =
                   fVar83 * *(float *)(uVar33 + 0x74) +
                   *(float *)(uVar33 + 0x134) * fVar7 + *(float *)(uVar33 + 0x194) +
                   fVar6 * *(float *)(uVar33 + 0xd4);
              auVar85._24_4_ =
                   fVar83 * *(float *)(uVar33 + 0x78) +
                   *(float *)(uVar33 + 0x138) * fVar7 + *(float *)(uVar33 + 0x198) +
                   fVar6 * *(float *)(uVar33 + 0xd8);
              auVar85._28_4_ = fVar75 + fVar94 + *(float *)(uVar33 + 0x7c);
              auVar81._0_4_ =
                   fVar83 * *(float *)(uVar33 + 0x80) +
                   fVar7 * local_14f8 + *(float *)(uVar33 + 0x1a0) +
                   fVar6 * *(float *)(uVar33 + 0xe0);
              auVar81._4_4_ =
                   fVar83 * *(float *)(uVar33 + 0x84) +
                   fVar7 * fStack_14f4 + *(float *)(uVar33 + 0x1a4) +
                   fVar6 * *(float *)(uVar33 + 0xe4);
              auVar81._8_4_ =
                   fVar83 * *(float *)(uVar33 + 0x88) +
                   fVar7 * fStack_14f0 + *(float *)(uVar33 + 0x1a8) +
                   fVar6 * *(float *)(uVar33 + 0xe8);
              auVar81._12_4_ =
                   fVar83 * *(float *)(uVar33 + 0x8c) +
                   fVar7 * fStack_14ec + *(float *)(uVar33 + 0x1ac) +
                   fVar6 * *(float *)(uVar33 + 0xec);
              auVar81._16_4_ =
                   fVar83 * *(float *)(uVar33 + 0x90) +
                   fVar7 * fStack_14e8 + *(float *)(uVar33 + 0x1b0) +
                   fVar6 * *(float *)(uVar33 + 0xf0);
              auVar81._20_4_ =
                   fVar83 * *(float *)(uVar33 + 0x94) +
                   fVar7 * fStack_14e4 + *(float *)(uVar33 + 0x1b4) +
                   fVar6 * *(float *)(uVar33 + 0xf4);
              auVar81._24_4_ =
                   fVar83 * *(float *)(uVar33 + 0x98) +
                   fVar7 * fStack_14e0 + *(float *)(uVar33 + 0x1b8) +
                   fVar6 * *(float *)(uVar33 + 0xf8);
              auVar81._28_4_ =
                   fVar75 + *(float *)(uVar33 + 0x9c) + *(float *)(uVar33 + 0x1bc) + fVar82;
              auVar10._4_4_ = fVar3 * *(float *)(uVar33 + 0x1c4) + fStack_1234;
              auVar10._0_4_ = fVar3 * *(float *)(uVar33 + 0x1c0) + local_1238;
              auVar10._8_4_ = fVar3 * *(float *)(uVar33 + 0x1c8) + fStack_1230;
              auVar10._12_4_ = fVar3 * *(float *)(uVar33 + 0x1cc) + fStack_122c;
              auVar10._16_4_ = fVar3 * *(float *)(uVar33 + 0x1d0) + local_1238;
              auVar10._20_4_ = fVar3 * *(float *)(uVar33 + 0x1d4) + fStack_1234;
              auVar10._24_4_ = fVar3 * *(float *)(uVar33 + 0x1d8) + fStack_1230;
              auVar10._28_4_ = fVar82;
              auVar46 = vsubps_avx(auVar10,auVar79);
              auVar10 = vsubps_avx(auVar104,auVar85);
              auVar12 = vsubps_avx(auVar65,auVar81);
              auVar44._0_4_ = fVar105 * auVar46._0_4_;
              auVar44._4_4_ = fVar108 * auVar46._4_4_;
              auVar44._8_4_ = fVar109 * auVar46._8_4_;
              auVar44._12_4_ = fVar110 * auVar46._12_4_;
              auVar11._16_4_ = fVar111 * auVar46._16_4_;
              auVar11._0_16_ = auVar44;
              auVar11._20_4_ = fVar112 * auVar46._20_4_;
              auVar11._24_4_ = fVar113 * auVar46._24_4_;
              auVar11._28_4_ = auVar46._28_4_;
              auVar71._0_4_ = fVar114 * auVar10._0_4_;
              auVar71._4_4_ = fVar116 * auVar10._4_4_;
              auVar71._8_4_ = fVar117 * auVar10._8_4_;
              auVar71._12_4_ = fVar118 * auVar10._12_4_;
              auVar22._16_4_ = fVar119 * auVar10._16_4_;
              auVar22._0_16_ = auVar71;
              auVar22._20_4_ = fVar120 * auVar10._20_4_;
              auVar22._24_4_ = fVar121 * auVar10._24_4_;
              auVar22._28_4_ = auVar10._28_4_;
              auVar60._0_4_ = fVar95 * auVar12._0_4_;
              auVar60._4_4_ = fVar98 * auVar12._4_4_;
              auVar60._8_4_ = fVar99 * auVar12._8_4_;
              auVar60._12_4_ = fVar100 * auVar12._12_4_;
              auVar23._16_4_ = fVar101 * auVar12._16_4_;
              auVar23._0_16_ = auVar60;
              auVar23._20_4_ = fVar102 * auVar12._20_4_;
              auVar23._24_4_ = fVar103 * auVar12._24_4_;
              auVar23._28_4_ = auVar12._28_4_;
              auVar46 = vsubps_avx(auVar55,auVar79);
              auVar10 = vsubps_avx(auVar90,auVar85);
              auVar12 = vsubps_avx(auVar93,auVar81);
              auVar52._0_4_ = fVar105 * auVar46._0_4_;
              auVar52._4_4_ = fVar108 * auVar46._4_4_;
              auVar52._8_4_ = fVar109 * auVar46._8_4_;
              auVar52._12_4_ = fVar110 * auVar46._12_4_;
              auVar24._16_4_ = fVar111 * auVar46._16_4_;
              auVar24._0_16_ = auVar52;
              auVar24._20_4_ = fVar112 * auVar46._20_4_;
              auVar24._24_4_ = fVar113 * auVar46._24_4_;
              auVar24._28_4_ = auVar46._28_4_;
              auVar84._0_4_ = fVar114 * auVar10._0_4_;
              auVar84._4_4_ = fVar116 * auVar10._4_4_;
              auVar84._8_4_ = fVar117 * auVar10._8_4_;
              auVar84._12_4_ = fVar118 * auVar10._12_4_;
              auVar25._16_4_ = fVar119 * auVar10._16_4_;
              auVar25._0_16_ = auVar84;
              auVar25._20_4_ = fVar120 * auVar10._20_4_;
              auVar25._24_4_ = fVar121 * auVar10._24_4_;
              auVar25._28_4_ = auVar85._28_4_;
              auVar78._0_4_ = fVar95 * auVar12._0_4_;
              auVar78._4_4_ = fVar98 * auVar12._4_4_;
              auVar78._8_4_ = fVar99 * auVar12._8_4_;
              auVar78._12_4_ = fVar100 * auVar12._12_4_;
              auVar26._16_4_ = fVar101 * auVar12._16_4_;
              auVar26._0_16_ = auVar78;
              auVar26._20_4_ = fVar102 * auVar12._20_4_;
              auVar26._24_4_ = fVar103 * auVar12._24_4_;
              auVar26._28_4_ = auVar10._28_4_;
              auVar77 = vpminsd_avx(auVar11._16_16_,auVar24._16_16_);
              auVar43 = vpminsd_avx(auVar44,auVar52);
              auVar91._16_16_ = auVar77;
              auVar91._0_16_ = auVar43;
              auVar77 = vpminsd_avx(auVar22._16_16_,auVar25._16_16_);
              auVar43 = vpminsd_avx(auVar71,auVar84);
              auVar96._16_16_ = auVar77;
              auVar96._0_16_ = auVar43;
              auVar77 = vpminsd_avx(auVar23._16_16_,auVar26._16_16_);
              auVar43 = vpminsd_avx(auVar60,auVar78);
              auVar92._16_16_ = auVar77;
              auVar92._0_16_ = auVar43;
              auVar46 = vmaxps_avx(auVar96,auVar92);
              auVar97 = ZEXT864(0) << 0x20;
              auVar77 = vpmaxsd_avx(auVar11._16_16_,auVar24._16_16_);
              auVar43 = vpmaxsd_avx(auVar44,auVar52);
              auVar48._16_16_ = auVar77;
              auVar48._0_16_ = auVar43;
              auVar77 = vpmaxsd_avx(auVar22._16_16_,auVar25._16_16_);
              auVar43 = vpmaxsd_avx(auVar71,auVar84);
              auVar56._16_16_ = auVar77;
              auVar56._0_16_ = auVar43;
              auVar77 = vpmaxsd_avx(auVar23._16_16_,auVar26._16_16_);
              auVar43 = vpmaxsd_avx(auVar60,auVar78);
              auVar66._16_16_ = auVar77;
              auVar66._0_16_ = auVar43;
              auVar12 = vminps_avx(auVar56,auVar66);
              auVar10 = vmaxps_avx(auVar106,auVar91);
              auVar46 = vmaxps_avx(auVar10,auVar46);
              auVar10 = vminps_avx(auVar115,auVar48);
              auVar10 = vminps_avx(auVar10,auVar12);
              auVar27._4_4_ = auVar46._4_4_ * 0.99999964;
              auVar27._0_4_ = auVar46._0_4_ * 0.99999964;
              auVar27._8_4_ = auVar46._8_4_ * 0.99999964;
              auVar27._12_4_ = auVar46._12_4_ * 0.99999964;
              auVar27._16_4_ = auVar46._16_4_ * 0.99999964;
              auVar27._20_4_ = auVar46._20_4_ * 0.99999964;
              auVar27._24_4_ = auVar46._24_4_ * 0.99999964;
              auVar27._28_4_ = 0x3f7ffffa;
              auVar67 = ZEXT3264(CONCAT428(0x3f800003,
                                           CONCAT424(0x3f800003,
                                                     CONCAT420(0x3f800003,
                                                               CONCAT416(0x3f800003,
                                                                         CONCAT412(0x3f800003,
                                                                                   CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar46._4_4_ = auVar10._4_4_ * 1.0000004;
              auVar46._0_4_ = auVar10._0_4_ * 1.0000004;
              auVar46._8_4_ = auVar10._8_4_ * 1.0000004;
              auVar46._12_4_ = auVar10._12_4_ * 1.0000004;
              auVar46._16_4_ = auVar10._16_4_ * 1.0000004;
              auVar46._20_4_ = auVar10._20_4_ * 1.0000004;
              auVar46._24_4_ = auVar10._24_4_ * 1.0000004;
              auVar46._28_4_ = auVar10._28_4_;
              auVar46 = vcmpps_avx(auVar27,auVar46,2);
            }
            else {
              pfVar2 = (float *)(uVar33 + 0x100 + uVar40);
              pfVar1 = (float *)(uVar33 + 0x40 + uVar40);
              auVar45._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar45._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar45._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar45._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar45._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar45._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar45._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar45._28_4_ = auVar49._28_4_ + pfVar1[7];
              auVar30._4_4_ = fVar83;
              auVar30._0_4_ = fVar83;
              auVar30._8_4_ = fVar83;
              auVar30._12_4_ = fVar83;
              auVar30._16_4_ = fVar83;
              auVar30._20_4_ = fVar83;
              auVar30._24_4_ = fVar83;
              auVar30._28_4_ = fVar83;
              auVar46 = vsubps_avx(auVar45,auVar30);
              auVar14._4_4_ = auVar58._4_4_ * auVar46._4_4_;
              auVar14._0_4_ = auVar58._0_4_ * auVar46._0_4_;
              auVar14._8_4_ = auVar58._8_4_ * auVar46._8_4_;
              auVar14._12_4_ = auVar58._12_4_ * auVar46._12_4_;
              auVar14._16_4_ = auVar58._0_4_ * auVar46._16_4_;
              auVar14._20_4_ = auVar58._4_4_ * auVar46._20_4_;
              auVar14._24_4_ = auVar58._8_4_ * auVar46._24_4_;
              auVar14._28_4_ = auVar46._28_4_;
              pfVar2 = (float *)(uVar33 + 0x100 + uVar37);
              pfVar1 = (float *)(uVar33 + 0x40 + uVar37);
              auVar53._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar53._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar53._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar53._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar53._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar53._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar53._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar53._28_4_ = auVar57._28_4_ + pfVar1[7];
              auVar29._4_4_ = fVar6;
              auVar29._0_4_ = fVar6;
              auVar29._8_4_ = fVar6;
              auVar29._12_4_ = fVar6;
              auVar29._16_4_ = fVar6;
              auVar29._20_4_ = fVar6;
              auVar29._24_4_ = fVar6;
              auVar29._28_4_ = fVar6;
              auVar46 = vsubps_avx(auVar53,auVar29);
              auVar15._4_4_ = auVar68._4_4_ * auVar46._4_4_;
              auVar15._0_4_ = auVar68._0_4_ * auVar46._0_4_;
              auVar15._8_4_ = auVar68._8_4_ * auVar46._8_4_;
              auVar15._12_4_ = auVar68._12_4_ * auVar46._12_4_;
              auVar15._16_4_ = auVar68._0_4_ * auVar46._16_4_;
              auVar15._20_4_ = auVar68._4_4_ * auVar46._20_4_;
              auVar15._24_4_ = auVar68._8_4_ * auVar46._24_4_;
              auVar15._28_4_ = auVar46._28_4_;
              pfVar2 = (float *)(uVar33 + 0x100 + uVar39);
              pfVar1 = (float *)(uVar33 + 0x40 + uVar39);
              auVar61._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar61._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar61._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar61._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar61._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar61._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar61._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar61._28_4_ = auVar67._28_4_ + pfVar1[7];
              auVar28._4_4_ = fVar7;
              auVar28._0_4_ = fVar7;
              auVar28._8_4_ = fVar7;
              auVar28._12_4_ = fVar7;
              auVar28._16_4_ = fVar7;
              auVar28._20_4_ = fVar7;
              auVar28._24_4_ = fVar7;
              auVar28._28_4_ = fVar7;
              auVar12 = vsubps_avx(auVar61,auVar28);
              auVar16._4_4_ = auVar80._4_4_ * auVar12._4_4_;
              auVar16._0_4_ = auVar80._0_4_ * auVar12._0_4_;
              auVar16._8_4_ = auVar80._8_4_ * auVar12._8_4_;
              auVar16._12_4_ = auVar80._12_4_ * auVar12._12_4_;
              auVar16._16_4_ = auVar80._0_4_ * auVar12._16_4_;
              auVar16._20_4_ = auVar80._4_4_ * auVar12._20_4_;
              auVar16._24_4_ = auVar80._8_4_ * auVar12._24_4_;
              auVar16._28_4_ = auVar12._28_4_;
              auVar46 = vmaxps_avx(auVar15,auVar16);
              auVar10 = vmaxps_avx(auVar106,auVar14);
              pfVar2 = (float *)(uVar33 + 0x100 + (uVar40 ^ 0x20));
              pfVar1 = (float *)(uVar33 + 0x40 + (uVar40 ^ 0x20));
              auVar62._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar62._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar62._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar62._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar62._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar62._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar62._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar62._28_4_ = auVar12._28_4_ + pfVar1[7];
              auVar46 = vmaxps_avx(auVar10,auVar46);
              auVar10 = vsubps_avx(auVar62,auVar30);
              pfVar2 = (float *)(uVar33 + 0x100 + (uVar37 ^ 0x20));
              auVar17._4_4_ = auVar69._4_4_ * auVar10._4_4_;
              auVar17._0_4_ = auVar69._0_4_ * auVar10._0_4_;
              auVar17._8_4_ = auVar69._8_4_ * auVar10._8_4_;
              auVar17._12_4_ = auVar69._12_4_ * auVar10._12_4_;
              auVar17._16_4_ = auVar69._0_4_ * auVar10._16_4_;
              auVar17._20_4_ = auVar69._4_4_ * auVar10._20_4_;
              auVar17._24_4_ = auVar69._8_4_ * auVar10._24_4_;
              auVar17._28_4_ = auVar10._28_4_;
              pfVar1 = (float *)(uVar33 + 0x40 + (uVar37 ^ 0x20));
              auVar63._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar63._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar63._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar63._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar63._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar63._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar63._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar63._28_4_ = auVar62._28_4_ + pfVar1[7];
              auVar10 = vsubps_avx(auVar63,auVar29);
              pfVar2 = (float *)(uVar33 + 0x100 + (uVar39 ^ 0x20));
              pfVar1 = (float *)(uVar33 + 0x40 + (uVar39 ^ 0x20));
              auVar72._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar72._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar72._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar72._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar72._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar72._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar72._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar72._28_4_ = fVar83 + pfVar1[7];
              auVar18._4_4_ = auVar70._4_4_ * auVar10._4_4_;
              auVar18._0_4_ = auVar70._0_4_ * auVar10._0_4_;
              auVar18._8_4_ = auVar70._8_4_ * auVar10._8_4_;
              auVar18._12_4_ = auVar70._12_4_ * auVar10._12_4_;
              auVar18._16_4_ = auVar70._0_4_ * auVar10._16_4_;
              auVar18._20_4_ = auVar70._4_4_ * auVar10._20_4_;
              auVar18._24_4_ = auVar70._8_4_ * auVar10._24_4_;
              auVar18._28_4_ = auVar10._28_4_;
              auVar10 = vsubps_avx(auVar72,auVar28);
              auVar19._4_4_ = auVar42._4_4_ * auVar10._4_4_;
              auVar19._0_4_ = auVar42._0_4_ * auVar10._0_4_;
              auVar19._8_4_ = auVar42._8_4_ * auVar10._8_4_;
              auVar19._12_4_ = auVar42._12_4_ * auVar10._12_4_;
              auVar19._16_4_ = auVar42._0_4_ * auVar10._16_4_;
              auVar19._20_4_ = auVar42._4_4_ * auVar10._20_4_;
              auVar19._24_4_ = auVar42._8_4_ * auVar10._24_4_;
              auVar19._28_4_ = auVar10._28_4_;
              auVar10 = vminps_avx(auVar18,auVar19);
              auVar67 = ZEXT3264(auVar10);
              auVar12 = vminps_avx(auVar115,auVar17);
              auVar10 = vminps_avx(auVar12,auVar10);
              auVar46 = vcmpps_avx(auVar46,auVar10,2);
              if (uVar35 == 6) {
                auVar10 = vcmpps_avx(*(undefined1 (*) [32])(uVar33 + 0x1c0),auVar41,2);
                auVar12 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar33 + 0x1e0),1);
                auVar67 = ZEXT3264(auVar12);
                auVar10 = vandps_avx(auVar10,auVar12);
                auVar46 = vandps_avx(auVar10,auVar46);
              }
            }
            auVar77 = vpackssdw_avx(auVar46._0_16_,auVar46._16_16_);
            auVar43 = vpsllw_avx(auVar77,0xf);
            auVar49 = ZEXT1664(auVar43);
            auVar77 = vpacksswb_avx(auVar43,auVar43);
            auVar57 = ZEXT1664(auVar77);
            bVar13 = SUB161(auVar77 >> 7,0) & 1 | (SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar77 >> 0x17,0) & 1) << 2 | (SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar77 >> 0x27,0) & 1) << 4 | (SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar77 >> 0x37,0) & 1) << 6 | SUB161(auVar77 >> 0x3f,0) << 7;
            if ((((((((auVar43 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar43 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar43 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar43 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar43[0xf]) goto LAB_00e51e32;
            lVar9 = 0;
            if (bVar13 != 0) {
              for (; (bVar13 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar34 = *(ulong *)(uVar33 + lVar9 * 8);
            uVar35 = bVar13 - 1 & (uint)bVar13;
            uVar36 = (ulong)uVar35;
          } while (uVar35 == 0);
          do {
            *puVar38 = uVar34;
            puVar38 = puVar38 + 1;
            lVar9 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar34 = *(ulong *)(uVar33 + lVar9 * 8);
            uVar36 = uVar36 - 1 & uVar36;
          } while (uVar36 != 0);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }